

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Chapter::ExpandDisplaysArray(Chapter *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  Display *pDVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  Display *pDVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  
  iVar3 = this->displays_size_;
  uVar4 = this->displays_count_;
  bVar12 = true;
  if (iVar3 <= (int)uVar4) {
    iVar11 = 1;
    if (iVar3 != 0) {
      iVar11 = iVar3 * 2;
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)iVar11;
    uVar10 = 0xffffffffffffffff;
    if (SUB168(auVar6 * ZEXT816(0x18),8) == 0) {
      uVar10 = SUB168(auVar6 * ZEXT816(0x18),0);
    }
    pDVar8 = (Display *)operator_new__(uVar10,(nothrow_t *)&std::nothrow);
    bVar12 = pDVar8 != (Display *)0x0;
    if (bVar12) {
      if (0 < (int)uVar4) {
        pDVar5 = this->displays_;
        lVar9 = 0;
        do {
          *(undefined8 *)((long)&pDVar8->country_ + lVar9) =
               *(undefined8 *)((long)&pDVar5->country_ + lVar9);
          puVar1 = (undefined8 *)((long)&pDVar5->title_ + lVar9);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pDVar8->title_ + lVar9);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          lVar9 = lVar9 + 0x18;
        } while ((ulong)uVar4 * 0x18 != lVar9);
      }
      if (this->displays_ != (Display *)0x0) {
        operator_delete__(this->displays_);
      }
      this->displays_ = pDVar8;
      this->displays_size_ = iVar11;
    }
  }
  return bVar12;
}

Assistant:

bool Chapter::ExpandDisplaysArray() {
  if (displays_size_ > displays_count_)
    return true;  // nothing to do yet

  const int size = (displays_size_ == 0) ? 1 : 2 * displays_size_;

  Display* const displays = new (std::nothrow) Display[size];  // NOLINT
  if (displays == NULL)
    return false;

  for (int idx = 0; idx < displays_count_; ++idx) {
    displays[idx] = displays_[idx];  // shallow copy
  }

  delete[] displays_;

  displays_ = displays;
  displays_size_ = size;

  return true;
}